

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void pystringtest_pystring_startswith(void)

{
  char cVar1;
  ostream *poVar2;
  allocator<char> local_8c;
  allocator<char> local_8b;
  allocator<char> local_8a;
  allocator<char> local_89;
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_28,"",&local_89);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"",&local_8a);
  cVar1 = pystring::startswith(local_28,local_48,0,0x7fffffff);
  if (cVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1ea);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::startswith(\"\", \"\")");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"true");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_68,"",&local_8b);
    std::__cxx11::string::string<std::allocator<char>>(local_88,"",&local_8c);
    pystring::startswith(local_68,local_88,0,0x7fffffff);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
  }
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"",&local_89);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"a",&local_8a);
  cVar1 = pystring::startswith(local_28,local_48,0,0x7fffffff);
  if (cVar1 != '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1eb);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::startswith(\"\", \"a\")");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"false");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_68,"",&local_8b);
    std::__cxx11::string::string<std::allocator<char>>(local_88,"a",&local_8c);
    pystring::startswith(local_68,local_88,0,0x7fffffff);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
  }
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"a",&local_89);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"",&local_8a);
  cVar1 = pystring::startswith(local_28,local_48,0,0x7fffffff);
  if (cVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1ec);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::startswith(\"a\", \"\")");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"true");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_68,"a",&local_8b);
    std::__cxx11::string::string<std::allocator<char>>(local_88,"",&local_8c);
    pystring::startswith(local_68,local_88,0,0x7fffffff);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
  }
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"abc",&local_89);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"ab",&local_8a);
  cVar1 = pystring::startswith(local_28,local_48,0,0x7fffffff);
  if (cVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1ed);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::startswith(\"abc\", \"ab\")");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"true");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_68,"abc",&local_8b);
    std::__cxx11::string::string<std::allocator<char>>(local_88,"ab",&local_8c);
    pystring::startswith(local_68,local_88,0,0x7fffffff);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
  }
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"abc",&local_89);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abc",&local_8a);
  cVar1 = pystring::startswith(local_28,local_48,0,0x7fffffff);
  if (cVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1ee);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::startswith(\"abc\", \"abc\")");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"true");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_68,"abc",&local_8b);
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abc",&local_8c);
    pystring::startswith(local_68,local_88,0,0x7fffffff);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
  }
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"abc",&local_89);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abcd",&local_8a);
  cVar1 = pystring::startswith(local_28,local_48,0,0x7fffffff);
  if (cVar1 != '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1ef);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::startswith(\"abc\", \"abcd\")");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"false");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_68,"abc",&local_8b);
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abcd",&local_8c);
    pystring::startswith(local_68,local_88,0,0x7fffffff);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
  }
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"abcdef",&local_89);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abc",&local_8a);
  cVar1 = pystring::startswith(local_28,local_48,0,0x7fffffff);
  if (cVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1f0);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::startswith(\"abcdef\", \"abc\")");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"true");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_68,"abcdef",&local_8b);
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abc",&local_8c);
    pystring::startswith(local_68,local_88,0,0x7fffffff);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
  }
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"abcdef",&local_89);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"abc",&local_8a);
  cVar1 = pystring::startswith(local_28,local_48,1,0x7fffffff);
  if (cVar1 != '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1f1);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::startswith(\"abcdef\", \"abc\", 1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"false");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_68,"abcdef",&local_8b);
    std::__cxx11::string::string<std::allocator<char>>(local_88,"abc",&local_8c);
    pystring::startswith(local_68,local_88,1,0x7fffffff);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
  }
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::string<std::allocator<char>>(local_28,"abcdef",&local_89);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"bc",&local_8a);
  cVar1 = pystring::startswith(local_28,local_48,1,0x7fffffff);
  if (cVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/imageworks[P]pystring/test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1f2);
    poVar2 = std::operator<<(poVar2,":\n");
    poVar2 = std::operator<<(poVar2,"FAILED: ");
    poVar2 = std::operator<<(poVar2,"pystring::startswith(\"abcdef\", \"bc\", 1)");
    poVar2 = std::operator<<(poVar2," == ");
    poVar2 = std::operator<<(poVar2,"true");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"\tvalues were \'");
    std::__cxx11::string::string<std::allocator<char>>(local_68,"abcdef",&local_8b);
    std::__cxx11::string::string<std::allocator<char>>(local_88,"bc",&local_8c);
    pystring::startswith(local_68,local_88,1,0x7fffffff);
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    poVar2 = std::operator<<(poVar2,"\' and \'");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::operator<<(poVar2,"\'\n");
    unit_test_failures = unit_test_failures + 1;
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
  }
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

PYSTRING_ADD_TEST(pystring, startswith)
{
    PYSTRING_CHECK_EQUAL(pystring::startswith("", ""), true);
    PYSTRING_CHECK_EQUAL(pystring::startswith("", "a"), false);
    PYSTRING_CHECK_EQUAL(pystring::startswith("a", ""), true);
    PYSTRING_CHECK_EQUAL(pystring::startswith("abc", "ab"), true);
    PYSTRING_CHECK_EQUAL(pystring::startswith("abc", "abc"), true);
    PYSTRING_CHECK_EQUAL(pystring::startswith("abc", "abcd"), false);
    PYSTRING_CHECK_EQUAL(pystring::startswith("abcdef", "abc"), true);
    PYSTRING_CHECK_EQUAL(pystring::startswith("abcdef", "abc", 1), false);
    PYSTRING_CHECK_EQUAL(pystring::startswith("abcdef", "bc", 1), true);
}